

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer pnga_create_handle(void)

{
  Integer g_a;
  Integer i;
  Integer ga_handle;
  Integer in_stack_00000178;
  char *in_stack_00000180;
  bool local_19;
  long local_10;
  long local_8;
  
  local_8 = -1;
  local_10 = 0;
  do {
    if (GA[local_10].actv_handle == 0) {
      local_8 = local_10;
    }
    local_10 = local_10 + 1;
    local_19 = local_10 < _max_global_array && local_8 == -1;
  } while (local_19);
  if (local_8 == -1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  gai_init_struct(0);
  GA[local_8].p_handle = GA_Init_Proc_Group;
  GA[local_8].ndim = -1;
  GA[local_8].name[0] = '\0';
  GA[local_8].mapc = (C_Integer *)0x0;
  GA[local_8].irreg = 0;
  GA[local_8].ghosts = 0;
  GA[local_8].corner_flag = -1;
  GA[local_8].cache = (double *)0x0;
  GA[local_8].distr_type = 0;
  GA[local_8].block_total = -1;
  GA[local_8].rstrctd_list = (C_Integer *)0x0;
  GA[local_8].rank_rstrctd = (C_Integer *)0x0;
  GA[local_8].num_rstrctd = 0;
  GA[local_8].actv_handle = 1;
  GA[local_8].has_data = 1;
  GA[local_8].property = 0;
  return local_8 + -1000;
}

Assistant:

Integer pnga_create_handle()
{
  Integer ga_handle, i, g_a;
  /*** Get next free global array handle ***/
  ga_handle =-1; i=0;
  do{
      if(!GA[i].actv_handle) ga_handle=i;
      i++;
  }while(i<_max_global_array && ga_handle==-1);
  if( ga_handle == -1)
      pnga_error(" too many arrays ", (Integer)_max_global_array);
  g_a = (Integer)ga_handle - GA_OFFSET;

  /*** fill in Global Info Record for g_a ***/
  gai_init_struct(ga_handle);
  GA[ga_handle].p_handle = GA_Init_Proc_Group;
  GA[ga_handle].ndim = -1;
  GA[ga_handle].name[0] = '\0';
  GA[ga_handle].mapc = NULL;
  GA[ga_handle].irreg = 0;
  GA[ga_handle].ghosts = 0;
  GA[ga_handle].corner_flag = -1;
  GA[ga_handle].cache = NULL;
  GA[ga_handle].distr_type = REGULAR;
  GA[ga_handle].block_total = -1;
  GA[ga_handle].rstrctd_list = NULL;
  GA[ga_handle].rank_rstrctd = NULL;
  GA[ga_handle].num_rstrctd = 0;   /* This is also used as a flag for   */
                                   /* restricted arrays. If it is zero, */
                                   /* then array is not restricted.     */
  GA[ga_handle].actv_handle = 1;
  GA[ga_handle].has_data = 1;
  GA[ga_handle].property = NO_PROPERTY;
  return g_a;
}